

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vc1Parser.h
# Opt level: O0

int64_t __thiscall VC1Unit::vc1_escape_buffer(VC1Unit *this,uint8_t *dst)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  int local_3c;
  int k;
  uint8_t *srcEnd;
  uint8_t *srcBuffer;
  uint8_t *initDstBuffer;
  uint8_t *srcStart;
  uint8_t *dst_local;
  VC1Unit *this_local;
  
  initDstBuffer = this->m_nalBuffer;
  puVar1 = this->m_nalBuffer + this->m_nalBufferLen;
  srcEnd = this->m_nalBuffer + 2;
  srcStart = dst;
  while (srcEnd < puVar1) {
    if (*srcEnd < 4) {
      if ((srcEnd[-2] == '\0') && (srcEnd[-1] == '\0')) {
        memcpy(srcStart,initDstBuffer,(long)srcEnd - (long)initDstBuffer);
        puVar2 = srcStart + ((long)srcEnd - (long)initDstBuffer);
        *puVar2 = '\x03';
        srcStart = puVar2 + 2;
        puVar2[1] = *srcEnd;
        srcEnd = srcEnd + 1;
        for (local_3c = 0; local_3c < 1; local_3c = local_3c + 1) {
          if (srcEnd < puVar1) {
            *srcStart = *srcEnd;
            srcEnd = srcEnd + 1;
            srcStart = srcStart + 1;
          }
        }
        initDstBuffer = srcEnd;
      }
      else {
        srcEnd = srcEnd + 1;
      }
    }
    else {
      srcEnd = srcEnd + 3;
    }
  }
  memcpy(srcStart,initDstBuffer,(long)puVar1 - (long)initDstBuffer);
  return (int64_t)(srcStart + (long)(puVar1 + (-(long)dst - (long)initDstBuffer)));
}

Assistant:

int64_t vc1_escape_buffer(uint8_t* dst) const
    {
        const uint8_t* srcStart = m_nalBuffer;
        const uint8_t* initDstBuffer = dst;
        const uint8_t* srcBuffer = m_nalBuffer;
        const uint8_t* srcEnd = m_nalBuffer + m_nalBufferLen;
        for (srcBuffer += 2; srcBuffer < srcEnd;)
        {
            if (*srcBuffer > 3)
                srcBuffer += 3;
            else if (srcBuffer[-2] == 0 && srcBuffer[-1] == 0)
            {
                memcpy(dst, srcStart, srcBuffer - srcStart);
                dst += srcBuffer - srcStart;
                *dst++ = 3;
                *dst++ = *srcBuffer++;
                for (int k = 0; k < 1; k++)
                    if (srcBuffer < srcEnd)
                    {
                        *dst++ = *srcBuffer++;
                    }
                srcStart = srcBuffer;
            }
            else
                srcBuffer++;
        }
        memcpy(dst, srcStart, srcEnd - srcStart);
        dst += srcEnd - srcStart;
        return dst - initDstBuffer;
    }